

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_array_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  uint uVar1;
  JSValueUnion JVar2;
  long lVar3;
  ulong uVar4;
  
  JVar2 = val.u;
  uVar1 = *(uint *)((long)JVar2.ptr + 0x40);
  if (uVar1 != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      if ((~*(uint *)(*(long *)((long)JVar2.ptr + 0x38) + lVar3) & 0xfffffffe) == 0) {
        (*mark_func)(rt,*(JSGCObjectHeader **)(*(long *)((long)JVar2.ptr + 0x38) + -8 + lVar3));
        uVar1 = *(uint *)((long)JVar2.ptr + 0x40);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < uVar1);
  }
  return;
}

Assistant:

static void js_array_mark(JSRuntime *rt, JSValueConst val,
                          JS_MarkFunc *mark_func)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_MarkValue(rt, p->u.array.u.values[i], mark_func);
    }
}